

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5IndexCharlenToBytelen(char *p,int nByte,int nChar)

{
  int iVar1;
  int iVar2;
  
  if (0 < nChar) {
    iVar2 = 0;
    iVar1 = 0;
    while (iVar1 < nByte) {
      iVar1 = iVar1 + 1;
      iVar2 = iVar2 + 1;
      if (iVar2 == nChar) {
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int sqlite3Fts5IndexCharlenToBytelen(
  const char *p, 
  int nByte, 
  int nChar
){
  int n = 0;
  int i;
  for(i=0; i<nChar; i++){
    if( n>=nByte ) return 0;      /* Input contains fewer than nChar chars */
    if( (unsigned char)p[n++]>=0xc0 ){
      while( (p[n] & 0xc0)==0x80 ){
        n++;
        if( n>=nByte ) break;
      }
    }
  }
  return n;
}